

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O3

void __thiscall QTreeModel::timerEvent(QTreeModel *this,QTimerEvent *ev)

{
  int iVar1;
  SortOrder SVar2;
  QTreeView *pQVar3;
  QHeaderView *pQVar4;
  
  if (*(TimerId *)(ev + 0x10) != (this->sortPendingTimer).m_id) {
    QObject::timerEvent((QTimerEvent *)this);
    return;
  }
  if (((*(TimerId *)(ev + 0x10) != Invalid) && (this->skipPendingSort == false)) &&
     (*(long *)(*(long *)&this->field_0x8 + 0x88) == 0)) {
    QBasicTimer::stop();
    pQVar3 = (QTreeView *)QMetaObject::cast((QObject *)&QTreeWidget::staticMetaObject);
    pQVar4 = QTreeView::header(pQVar3);
    iVar1 = QHeaderView::sortIndicatorSection(pQVar4);
    pQVar3 = (QTreeView *)QMetaObject::cast((QObject *)&QTreeWidget::staticMetaObject);
    pQVar4 = QTreeView::header(pQVar3);
    SVar2 = QHeaderView::sortIndicatorOrder(pQVar4);
    (**(code **)(*(long *)this + 0x140))(this,iVar1,SVar2,*(code **)(*(long *)this + 0x140));
    return;
  }
  return;
}

Assistant:

void QTreeModel::timerEvent(QTimerEvent *ev)
{
    if (ev->timerId() == sortPendingTimer.timerId()) {
        executePendingSort();
    } else {
        QAbstractItemModel::timerEvent(ev);
    }
}